

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx2.cpp
# Opt level: O0

int __thiscall ncnn::LSTM_x86_avx2::create_pipeline(LSTM_x86_avx2 *this,Option *opt)

{
  long in_RSI;
  Option *in_stack_00000020;
  Mat *in_stack_00000028;
  Mat *in_stack_00000030;
  
  if ((*(byte *)(in_RSI + 0x2f) & 1) != 0) {
    cast_float32_to_float16(in_stack_00000030,in_stack_00000028,in_stack_00000020);
    cast_float32_to_float16(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  return 0;
}

Assistant:

int LSTM_x86_avx2::create_pipeline(const Option& opt)
{
#if __AVX2__
    if (opt.use_weight_fp16_storage)
    {
        ncnn::cast_float32_to_float16(weight_xc_data, weight_xc_data_fp16, opt);
        ncnn::cast_float32_to_float16(weight_hc_data, weight_hc_data_fp16, opt);
    }
#else
    (void)(opt);
#endif // __AVX__

    return 0;
}